

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  int iVar1;
  string *psVar2;
  EnumDescriptor *pEVar3;
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  local_40 = 0x45;
  local_38 = "Illegal jstype for int64, uint64, sint64, fixed64 or sfixed64 field: ";
  pEVar3 = google::protobuf::FieldOptions_JSType_descriptor();
  iVar1 = **(int **)this;
  if ((long)iVar1 < 0) {
    InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
              ();
  }
  else if (iVar1 < pEVar3->value_count_) {
    psVar2 = pEVar3->values_[iVar1].all_names_;
    local_70.piece_._M_str = (psVar2->_M_dataplus)._M_p;
    local_70.piece_._M_len = psVar2->_M_string_length;
    StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,
                      (AlphaNum *)local_70.piece_._M_str);
    return __return_storage_ptr__;
  }
  InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
            ();
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}